

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

ConfidentialTxOutReference * __thiscall
cfd::ConfidentialTransactionController::UpdateTxOutFeeAmount
          (ConfidentialTransactionController *this,uint32_t index,Amount *value,
          ConfidentialAssetId *asset)

{
  uint32_t index_00;
  bool bVar1;
  undefined8 uVar2;
  ConfidentialTxOutReference *this_00;
  Amount *in_RCX;
  uint32_t in_EDX;
  long in_RSI;
  ConfidentialTxOutReference *in_RDI;
  ConfidentialAssetId *in_R8;
  ConfidentialTxOutReference ref;
  AbstractTxOutReference *in_stack_fffffffffffffd98;
  Script *in_stack_fffffffffffffda0;
  string *in_stack_fffffffffffffdb0;
  CfdException *this_01;
  ByteData local_210;
  ByteData local_1f8;
  ConfidentialNonce local_1e0;
  ConfidentialValue local_1b8;
  undefined1 local_18a;
  undefined1 local_189 [49];
  Script local_158;
  ConfidentialTxOutReference local_120;
  ConfidentialAssetId *local_28;
  Amount *local_20;
  uint32_t local_14;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  core::ConfidentialTransaction::GetTxOut
            (&local_120,(ConfidentialTransaction *)(in_RSI + 0x10),in_EDX);
  core::AbstractTxOutReference::GetLockingScript(in_stack_fffffffffffffd98);
  bVar1 = core::Script::IsEmpty(&local_158);
  core::Script::~Script(in_stack_fffffffffffffda0);
  index_00 = local_14;
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_00 = (ConfidentialTxOutReference *)(in_RSI + 0x10);
    core::ConfidentialValue::ConfidentialValue(&local_1b8,local_20);
    core::ConfidentialNonce::ConfidentialNonce(&local_1e0);
    core::ByteData::ByteData(&local_1f8);
    core::ByteData::ByteData(&local_210);
    core::ConfidentialTransaction::SetTxOutCommitment
              ((ConfidentialTransaction *)this_00,index_00,local_28,&local_1b8,&local_1e0,&local_1f8
               ,&local_210);
    core::ByteData::~ByteData((ByteData *)0x557b93);
    core::ByteData::~ByteData((ByteData *)0x557b9d);
    core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x557baa);
    core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x557bb7);
    core::ConfidentialTransaction::GetTxOut
              (in_RDI,(ConfidentialTransaction *)(in_RSI + 0x10),local_14);
    core::ConfidentialTxOutReference::~ConfidentialTxOutReference(this_00);
    return in_RDI;
  }
  local_18a = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  this_01 = (CfdException *)local_189;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_189 + 1),"target is not fee txout.",(allocator *)this_01);
  core::CfdException::CfdException
            (this_01,(CfdError)((ulong)uVar2 >> 0x20),in_stack_fffffffffffffdb0);
  local_18a = 0;
  __cxa_throw(uVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

const ConfidentialTxOutReference
ConfidentialTransactionController::UpdateTxOutFeeAmount(
    uint32_t index, const Amount& value, const ConfidentialAssetId& asset) {
  ConfidentialTxOutReference ref = transaction_.GetTxOut(index);
  if (!ref.GetLockingScript().IsEmpty()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "target is not fee txout.");
  }
  transaction_.SetTxOutCommitment(
      index, asset, ConfidentialValue(value), ConfidentialNonce(), ByteData(),
      ByteData());
  return transaction_.GetTxOut(index);
}